

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
          *f)

{
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
  *this_00;
  alignment aVar1;
  unsigned_long __n;
  wchar_t *pwVar2;
  ulong local_78;
  size_t left_padding;
  size_t padding;
  type pwStack_50;
  char_type fill;
  wchar_t **local_48;
  type *it;
  ulong local_38;
  size_t num_code_points;
  size_t size;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
  *ppStack_20;
  uint width;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
  *f_local;
  align_spec *spec_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_local;
  
  ppStack_20 = f;
  f_local = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
             *)spec;
  spec_local = (align_spec *)this;
  size._4_4_ = align_spec::width(spec);
  local_78 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
             padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
             ::size(ppStack_20);
  num_code_points = local_78;
  if (size._4_4_ != 0) {
    local_78 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
               ::
               padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
               ::width(ppStack_20);
  }
  this_00 = ppStack_20;
  local_38 = local_78;
  if (local_78 < size._4_4_) {
    pwStack_50 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                 ::reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                            *)this,(ulong)size._4_4_ + (num_code_points - local_78));
    local_48 = &stack0xffffffffffffffb0;
    padding._4_4_ = align_spec::fill((align_spec *)f_local);
    __n = size._4_4_ - local_38;
    aVar1 = align_spec::align((align_spec *)f_local);
    if (aVar1 == ALIGN_RIGHT) {
      pwVar2 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                         (*local_48,__n,(wchar_t *)((long)&padding + 4));
      *local_48 = pwVar2;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)ppStack_20,local_48);
    }
    else {
      aVar1 = align_spec::align((align_spec *)f_local);
      if (aVar1 == ALIGN_CENTER) {
        pwVar2 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           (*local_48,__n >> 1,(wchar_t *)((long)&padding + 4));
        *local_48 = pwVar2;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                      *)ppStack_20,local_48);
        pwVar2 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           (*local_48,__n - (__n >> 1),(wchar_t *)((long)&padding + 4));
        *local_48 = pwVar2;
      }
      else {
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                      *)ppStack_20,local_48);
        pwVar2 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                           (*local_48,__n,(wchar_t *)((long)&padding + 4));
        *local_48 = pwVar2;
      }
    }
  }
  else {
    it = (type *)basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                 ::reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                            *)this,num_code_points);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                  *)this_00,(wchar_t **)&it);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }